

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitrate.c
# Opt level: O0

void vorbis_bitrate_init(vorbis_info *vi,bitrate_manager_state *bm)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  long desired_fill;
  int halfsamples;
  long ratesamples;
  bitrate_manager_info *bi;
  codec_setup_info *ci;
  bitrate_manager_state *bm_local;
  vorbis_info *vi_local;
  
  plVar1 = (long *)vi->codec_setup;
  memset(bm,0,0x50);
  if ((plVar1 + 0x2a8 != (long *)0x0) && (0 < plVar1[0x2ab])) {
    lVar2 = vi->rate;
    iVar3 = (int)(*plVar1 >> 1);
    bm->short_per_long = plVar1[1] / *plVar1;
    bm->managed = 1;
    dVar4 = rint(((double)plVar1[0x2a8] * 1.0 * (double)iVar3) / (double)lVar2);
    bm->avg_bitsper = (long)dVar4;
    dVar4 = rint(((double)plVar1[0x2a9] * 1.0 * (double)iVar3) / (double)lVar2);
    bm->min_bitsper = (long)dVar4;
    dVar4 = rint(((double)plVar1[0x2aa] * 1.0 * (double)iVar3) / (double)lVar2);
    bm->max_bitsper = (long)dVar4;
    bm->avgfloat = 7.0;
    lVar2 = plVar1[0x2ab];
    dVar4 = (double)plVar1[0x2ac];
    bm->minmax_reservoir = (long)((double)lVar2 * dVar4);
    bm->avg_reservoir = (long)((double)lVar2 * dVar4);
  }
  return;
}

Assistant:

void vorbis_bitrate_init(vorbis_info *vi,bitrate_manager_state *bm){
  codec_setup_info *ci=vi->codec_setup;
  bitrate_manager_info *bi=&ci->bi;

  memset(bm,0,sizeof(*bm));

  if(bi && (bi->reservoir_bits>0)){
    long ratesamples=vi->rate;
    int  halfsamples=ci->blocksizes[0]>>1;

    bm->short_per_long=ci->blocksizes[1]/ci->blocksizes[0];
    bm->managed=1;

    bm->avg_bitsper= rint(1.*bi->avg_rate*halfsamples/ratesamples);
    bm->min_bitsper= rint(1.*bi->min_rate*halfsamples/ratesamples);
    bm->max_bitsper= rint(1.*bi->max_rate*halfsamples/ratesamples);

    bm->avgfloat=PACKETBLOBS/2;

    /* not a necessary fix, but one that leads to a more balanced
       typical initialization */
    {
      long desired_fill=bi->reservoir_bits*bi->reservoir_bias;
      bm->minmax_reservoir=desired_fill;
      bm->avg_reservoir=desired_fill;
    }

  }
}